

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# exp.h
# Opt level: O2

RegEx * YAML::Exp::Key(void)

{
  int iVar1;
  RegEx *ex2;
  RegEx RStack_28;
  
  if (Key()::e == '\0') {
    iVar1 = __cxa_guard_acquire(&Key()::e);
    if (iVar1 != 0) {
      RegEx::RegEx(&RStack_28,'?');
      ex2 = BlankOrBreak();
      operator+(&Key::e,&RStack_28,ex2);
      std::vector<YAML::RegEx,_std::allocator<YAML::RegEx>_>::~vector(&RStack_28.m_params);
      __cxa_atexit(RegEx::~RegEx,&Key::e,&__dso_handle);
      __cxa_guard_release(&Key()::e);
    }
  }
  return &Key::e;
}

Assistant:

inline const RegEx& Key() {
  static const RegEx e = RegEx('?') + BlankOrBreak();
  return e;
}